

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4_compressHC_continue_generic
              (LZ4_streamHC_t *LZ4_streamHCPtr,char *src,char *dst,int *srcSizePtr,int dstCapacity,
              limitedOutput_directive limit)

{
  uint uVar1;
  LZ4_byte *pLVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  LZ4_byte *pLVar6;
  LZ4_u32 LVar7;
  ulong uVar8;
  LZ4_byte *pLVar9;
  
  pLVar9 = (LZ4_streamHCPtr->internal_donotuse).end;
  pcVar5 = (char *)LZ4_streamHCPtr->table[0x8001];
  if (pcVar5 == (char *)0x0) {
    if ((LZ4_byte *)0x40000000 < pLVar9) {
      pLVar9 = (LZ4_byte *)0x0;
      memset(LZ4_streamHCPtr,0,0x20000);
      memset(LZ4_streamHCPtr->table + 0x4000,0xff,0x20000);
    }
    LVar7 = (int)pLVar9 + 0x10000;
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = LVar7;
    pcVar5 = src + (-0x10000 - (long)pLVar9);
    LZ4_streamHCPtr->table[0x8001] = pcVar5;
    (LZ4_streamHCPtr->internal_donotuse).end = (LZ4_byte *)src;
    LZ4_streamHCPtr->table[0x8002] = pcVar5;
    (LZ4_streamHCPtr->internal_donotuse).dictLimit = LVar7;
    (LZ4_streamHCPtr->internal_donotuse).lowLimit = LVar7;
    pLVar9 = (LZ4_byte *)src;
  }
  if (0x80000000 < (ulong)((long)pLVar9 - (long)pcVar5)) {
    uVar8 = ((long)pLVar9 - (long)pcVar5) - (ulong)(LZ4_streamHCPtr->internal_donotuse).dictLimit;
    if (0xffff < uVar8) {
      uVar8 = 0x10000;
    }
    LZ4_loadDictHC(LZ4_streamHCPtr,(char *)(pLVar9 + -uVar8),(int)uVar8);
    pLVar9 = (LZ4_byte *)LZ4_streamHCPtr->table[0x8000];
  }
  if (pLVar9 != (LZ4_byte *)src) {
    LZ4HC_setExternalDict(&LZ4_streamHCPtr->internal_donotuse,(BYTE *)src);
  }
  pLVar6 = (LZ4_byte *)(src + *srcSizePtr);
  pLVar2 = (LZ4_streamHCPtr->internal_donotuse).dictBase;
  uVar1 = (LZ4_streamHCPtr->internal_donotuse).dictLimit;
  pLVar9 = pLVar2 + uVar1;
  if (src < pLVar9 && pLVar2 + (LZ4_streamHCPtr->internal_donotuse).lowLimit < pLVar6) {
    iVar4 = (int)pLVar6;
    if (pLVar9 < pLVar6) {
      iVar4 = (int)pLVar9;
    }
    uVar3 = iVar4 - (int)pLVar2;
    if (uVar1 - uVar3 < 4) {
      uVar3 = uVar1;
    }
    (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar3;
  }
  iVar4 = LZ4HC_compress_generic
                    (&LZ4_streamHCPtr->internal_donotuse,src,dst,srcSizePtr,dstCapacity,
                     (int)(LZ4_streamHCPtr->internal_donotuse).compressionLevel,limit);
  return iVar4;
}

Assistant:

static int
LZ4_compressHC_continue_generic (LZ4_streamHC_t* LZ4_streamHCPtr,
                                 const char* src, char* dst,
                                 int* srcSizePtr, int dstCapacity,
                                 limitedOutput_directive limit)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(5, "LZ4_compressHC_continue_generic(ctx=%p, src=%p, srcSize=%d, limit=%d)",
                LZ4_streamHCPtr, src, *srcSizePtr, limit);
    assert(ctxPtr != NULL);
    /* auto-init if forgotten */
    if (ctxPtr->base == NULL) LZ4HC_init_internal (ctxPtr, (const BYTE*) src);

    /* Check overflow */
    if ((size_t)(ctxPtr->end - ctxPtr->base) > 2 GB) {
        size_t dictSize = (size_t)(ctxPtr->end - ctxPtr->base) - ctxPtr->dictLimit;
        if (dictSize > 64 KB) dictSize = 64 KB;
        LZ4_loadDictHC(LZ4_streamHCPtr, (const char*)(ctxPtr->end) - dictSize, (int)dictSize);
    }

    /* Check if blocks follow each other */
    if ((const BYTE*)src != ctxPtr->end)
        LZ4HC_setExternalDict(ctxPtr, (const BYTE*)src);

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) src + *srcSizePtr;
        const BYTE* const dictBegin = ctxPtr->dictBase + ctxPtr->lowLimit;
        const BYTE* const dictEnd   = ctxPtr->dictBase + ctxPtr->dictLimit;
        if ((sourceEnd > dictBegin) && ((const BYTE*)src < dictEnd)) {
            if (sourceEnd > dictEnd) sourceEnd = dictEnd;
            ctxPtr->lowLimit = (U32)(sourceEnd - ctxPtr->dictBase);
            if (ctxPtr->dictLimit - ctxPtr->lowLimit < 4) ctxPtr->lowLimit = ctxPtr->dictLimit;
    }   }

    return LZ4HC_compress_generic (ctxPtr, src, dst, srcSizePtr, dstCapacity, ctxPtr->compressionLevel, limit);
}